

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_A_ExtChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *actor;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  FState *meleestate;
  char *pcVar5;
  FState *missilestate;
  bool bVar6;
  bool nightmarefast;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_004f761a:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xaf9,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_004f761a;
  }
  actor = (AActor *)(param->field_0).field_1.a;
  if (actor != (AActor *)0x0) {
    if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar3 = (**(actor->super_DThinker).super_DObject._vptr_DObject)();
      (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
    }
    pPVar4 = (actor->super_DThinker).super_DObject.Class;
    bVar6 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar6) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004f761a;
    }
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_004f75d3:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xafa,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_004f75d3;
  }
  if (numparam < 3) {
    pcVar5 = "(paramnum) < numparam";
LAB_004f75fb:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xafb,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_004f75fb;
  }
  bVar6 = true;
  if (numparam != 3) {
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\0') {
      bVar6 = param[3].field_0.i != 0;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                    ,0xafc,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if (4 < numparam) {
    VVar1 = param[4].field_0.field_3.Type;
    if (VVar1 == '\0') {
      nightmarefast = param[4].field_0.i != 0;
      goto LAB_004f7565;
    }
    if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                    ,0xafd,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  nightmarefast = false;
LAB_004f7565:
  if (param[1].field_0.i == 0) {
    meleestate = (FState *)0x0;
  }
  else {
    meleestate = actor->MeleeState;
  }
  if (param[2].field_0.i == 0) {
    missilestate = (FState *)0x0;
  }
  else {
    missilestate = actor->MissileState;
  }
  A_DoChase((VMFrameStack *)0x0,actor,false,meleestate,missilestate,bVar6,nightmarefast,false,0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_ExtChase)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL		(domelee);
	PARAM_BOOL		(domissile);
	PARAM_BOOL_OPT	(playactive)	{ playactive = true; }
	PARAM_BOOL_OPT	(nightmarefast)	{ nightmarefast = false; }

	// Now that A_Chase can handle state label parameters, this function has become rather useless...
	A_DoChase(stack, self, false,
		domelee ? self->MeleeState : NULL, domissile ? self->MissileState : NULL,
		playactive, nightmarefast, false, 0);
	return 0;
}